

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

void __thiscall
TEST_MockReturnValueTest_PositiveLongLongIntReturnValueCanBeRetrievedAsUnsignedLongLongInt_Test::
testBody(TEST_MockReturnValueTest_PositiveLongLongIntReturnValueCanBeRetrievedAsUnsignedLongLongInt_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  undefined4 extraout_var_00;
  cpputest_ulonglong cVar4;
  TestTerminator *pTVar5;
  SimpleString local_80;
  SimpleString local_70;
  MockNamedValue local_60;
  
  SimpleString::SimpleString((SimpleString *)&local_60,"");
  pMVar2 = mock((SimpleString *)&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_80);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xe8))
            ((long *)CONCAT44(extraout_var,iVar1),7);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xa8))
            (&local_60,(long *)CONCAT44(extraout_var_00,iVar1));
  cVar4 = MockNamedValue::getUnsignedLongLongIntValue(&local_60);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x11])
            (pUVar3,7,cVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x81,pTVar5);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockReturnValueTest, PositiveLongLongIntReturnValueCanBeRetrievedAsUnsignedLongLongInt)
{
    long long int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);
    UNSIGNED_LONGLONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedLongLongIntValue());
}